

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void * xmlXPathPopExternal(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr obj_00;
  void *ret;
  xmlXPathObjectPtr obj;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->value == (xmlXPathObjectPtr)0x0)) {
    xmlXPatherror(ctxt,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                  ,0xbef,10);
    if (ctxt != (xmlXPathParserContextPtr)0x0) {
      ctxt->error = 10;
    }
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if (ctxt->value->type == XPATH_USERS) {
    obj_00 = valuePop(ctxt);
    ctxt_local = (xmlXPathParserContextPtr)obj_00->user;
    obj_00->user = (void *)0x0;
    xmlXPathReleaseObject(ctxt->context,obj_00);
  }
  else {
    xmlXPatherror(ctxt,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                  ,0xbf3,0xb);
    if (ctxt != (xmlXPathParserContextPtr)0x0) {
      ctxt->error = 0xb;
    }
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  return ctxt_local;
}

Assistant:

void *
xmlXPathPopExternal (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    void * ret;

    if ((ctxt == NULL) || (ctxt->value == NULL)) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(NULL);
    }
    if (ctxt->value->type != XPATH_USERS) {
	xmlXPathSetTypeError(ctxt);
	return(NULL);
    }
    obj = valuePop(ctxt);
    ret = obj->user;
    obj->user = NULL;
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}